

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

Error * ot::commissioner::coap::Message::Deserialize
                  (Error *__return_storage_ptr__,Header *aHeader,ByteArray *aBuf,size_t *aOffset)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  ushort uVar5;
  byte bVar6;
  char *pcVar7;
  byte bVar8;
  ulong uVar9;
  char *pcVar10;
  pointer puVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar12;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  writer write;
  string local_c0;
  ulong local_a0;
  ulong local_98;
  undefined1 local_90 [40];
  format_string_checker<char> local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_a0 = *aOffset;
  puVar11 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar9 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar11;
  if (local_a0 < uVar9) {
    if (local_a0 + 1 < uVar9) {
      if (local_a0 + 3 < uVar9) {
        bVar2 = puVar11[local_a0];
        bVar3 = puVar11[local_a0 + 1];
        aVar12._1_7_ = in_R9._1_7_;
        aVar12._0_1_ = bVar3;
        uVar5 = *(ushort *)(puVar11 + local_a0 + 2);
        local_a0 = local_a0 + 4;
        if ((bVar2 & 0xf) != 0) {
          uVar1 = local_a0 + (bVar2 & 0xf);
          if (uVar9 < uVar1) {
            local_68.types_[0] = none_type;
            local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
                 "premature end of CoAP message header";
            local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
            local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
            local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
            local_68.parse_funcs_[0] = (parse_func)0x0;
            pcVar7 = "premature end of CoAP message header";
            write.handler_ = &local_68;
            local_68.context_.types_ = local_68.types_;
            while (pcVar7 != "") {
              cVar4 = *pcVar7;
              pcVar10 = pcVar7;
              while (cVar4 != '{') {
                pcVar10 = pcVar10 + 1;
                if (pcVar10 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                  writer::operator()(&write,pcVar7,"");
                  goto LAB_00141c32;
                }
                cVar4 = *pcVar10;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()(&write,pcVar7,pcVar10);
              pcVar7 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                 (pcVar10,"",&local_68);
            }
LAB_00141c32:
            args_02.field_1.args_ = aVar12.args_;
            args_02.desc_ = (unsigned_long_long)&local_68;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_c0,(v10 *)"premature end of CoAP message header",
                       (string_view)ZEXT816(0x24),args_02);
            local_90._0_4_ = kBadFormat;
            std::__cxx11::string::string((string *)(local_90 + 8),(string *)&local_c0);
            goto LAB_00141c67;
          }
          puVar11 = puVar11 + local_a0;
          bVar6 = (byte)(bVar2 & 0xf);
          bVar8 = 8;
          if (bVar6 < 8) {
            bVar8 = bVar6;
          }
          local_a0 = uVar1;
          memcpy(&local_98,puVar11,(ulong)bVar8);
          aVar12._1_7_ = 0;
          uVar9 = local_98;
        }
        *(byte *)aHeader = bVar2 >> 2 & 0xc | bVar2 >> 6 | bVar2 << 4;
        aHeader->mCode = aVar12._0_1_;
        aHeader->mMessageId = uVar5 << 8 | uVar5 >> 8;
        *(ulong *)aHeader->mToken = uVar9;
        *aOffset = local_a0;
        return __return_storage_ptr__;
      }
      local_68.types_[0] = none_type;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "premature end of CoAP message header";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_68.parse_funcs_[0] = (parse_func)0x0;
      pcVar7 = "premature end of CoAP message header";
      write.handler_ = &local_68;
      local_68.context_.types_ = local_68.types_;
      while (pcVar7 != "") {
        cVar4 = *pcVar7;
        pcVar10 = pcVar7;
        while (cVar4 != '{') {
          pcVar10 = pcVar10 + 1;
          if (pcVar10 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&write,pcVar7,"");
            goto LAB_00141b7d;
          }
          cVar4 = *pcVar10;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&write,pcVar7,pcVar10);
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar10,"",&local_68);
      }
LAB_00141b7d:
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_c0,(v10 *)"premature end of CoAP message header",(string_view)ZEXT816(0x24),
                 args_01);
      local_90._0_4_ = kBadFormat;
      std::__cxx11::string::string((string *)(local_90 + 8),(string *)&local_c0);
    }
    else {
      local_68.types_[0] = none_type;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "premature end of CoAP message header";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_68.parse_funcs_[0] = (parse_func)0x0;
      pcVar7 = "premature end of CoAP message header";
      write.handler_ = &local_68;
      local_68.context_.types_ = local_68.types_;
      while (pcVar7 != "") {
        cVar4 = *pcVar7;
        pcVar10 = pcVar7;
        while (cVar4 != '{') {
          pcVar10 = pcVar10 + 1;
          if (pcVar10 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&write,pcVar7,"");
            goto LAB_00141ab3;
          }
          cVar4 = *pcVar10;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&write,pcVar7,pcVar10);
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar10,"",&local_68);
      }
LAB_00141ab3:
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_c0,(v10 *)"premature end of CoAP message header",(string_view)ZEXT816(0x24),
                 args_00);
      local_90._0_4_ = kBadFormat;
      std::__cxx11::string::string((string *)(local_90 + 8),(string *)&local_c0);
    }
  }
  else {
    local_68.types_[0] = none_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "premature end of CoAP message header";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    pcVar7 = "premature end of CoAP message header";
    write.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    while (pcVar7 != "") {
      cVar4 = *pcVar7;
      pcVar10 = pcVar7;
      while (cVar4 != '{') {
        pcVar10 = pcVar10 + 1;
        if (pcVar10 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar7,"");
          goto LAB_001419e9;
        }
        cVar4 = *pcVar10;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar7,pcVar10);
      pcVar7 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar10,"",&local_68);
    }
LAB_001419e9:
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_c0,(v10 *)"premature end of CoAP message header",(string_view)ZEXT816(0x24),
               args);
    local_90._0_4_ = kBadFormat;
    std::__cxx11::string::string((string *)(local_90 + 8),(string *)&local_c0);
  }
LAB_00141c67:
  Error::operator=(__return_storage_ptr__,(Error *)local_90);
  std::__cxx11::string::~string((string *)(local_90 + 8));
  std::__cxx11::string::~string((string *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

Error Message::Deserialize(Header &aHeader, const ByteArray &aBuf, size_t &aOffset)
{
    Error  error;
    Header header;
    size_t offset = aOffset;

    VerifyOrExit(offset < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
    header.mVersion     = aBuf[offset] >> 6;
    header.mType        = aBuf[offset] >> 4;
    header.mTokenLength = aBuf[offset++];

    VerifyOrExit(offset < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
    header.mCode = aBuf[offset++];

    VerifyOrExit(offset + 1 < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
    header.mMessageId = aBuf[offset++];
    header.mMessageId = (header.mMessageId << 8) | aBuf[offset++];

    if (header.mTokenLength != 0)
    {
        VerifyOrExit(offset + header.mTokenLength <= aBuf.size(),
                     error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
        memcpy(header.mToken, &aBuf[offset], std::min(header.mTokenLength, kMaxTokenLength));
        offset += header.mTokenLength;
    }

    aHeader = header;
    aOffset = offset;

exit:
    return error;
}